

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
::uninitialized_move_n
          (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
          *x,allocator_type *alloc)

{
  template_ElementType<2UL> *ptVar1;
  _Tuple_impl<0UL,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var2;
  _Tuple_impl<0UL,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long lVar3;
  
  btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
  ::GetField<2ul>((btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
                   *)x);
  ptVar1 = btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
           ::GetField<2ul>((btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
                            *)this);
  p_Var2 = &ptVar1[i].
            super__Tuple_impl<0UL,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  ptVar1 = btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
           ::GetField<2ul>((btree_node<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
                            *)x);
  this_00 = &ptVar1[j].
             super__Tuple_impl<0UL,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  for (lVar3 = n * 0x28; lVar3 != 0; lVar3 = lVar3 + -0x28) {
    std::
    _Tuple_impl<0UL,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Tuple_impl(this_00,p_Var2);
    p_Var2 = p_Var2 + 1;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }